

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLsInitialize(CVodeMem cv_mem)

{
  void *pvVar1;
  int iVar2;
  CVodeMem pCVar3;
  long lVar4;
  
  pvVar1 = cv_mem->cv_lmem;
  if (pvVar1 == (void *)0x0) {
    cvProcessError(cv_mem,-2,0x580,"cvLsInitialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                   ,"Linear solver memory is NULL.");
    return -2;
  }
  if (*(long *)((long)pvVar1 + 0x50) == 0) {
    *(undefined4 *)((long)pvVar1 + 8) = 0;
    *(undefined4 *)((long)pvVar1 + 0x120) = 0;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x128) = 0;
    *(undefined8 *)((long)pvVar1 + 0x130) = 0;
  }
  else if (*(int *)((long)pvVar1 + 0x120) == 0) {
    *(code **)((long)pvVar1 + 0x128) = cvLsLinSys;
    *(CVodeMem *)((long)pvVar1 + 0x130) = cv_mem;
    if (*(int *)((long)pvVar1 + 8) == 0) {
      pCVar3 = (CVodeMem)cv_mem->cv_user_data;
    }
    else {
      if ((**(long **)(*(long *)((long)pvVar1 + 0x50) + 8) == 0) ||
         ((iVar2 = SUNMatGetID(), iVar2 != 0 &&
          (iVar2 = SUNMatGetID(*(undefined8 *)((long)pvVar1 + 0x50)), iVar2 != 3)))) {
        cvProcessError(cv_mem,-3,0x5a9,"cvLsInitialize",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                       ,"No Jacobian constructor available for SUNMatrix type");
        *(undefined4 *)((long)pvVar1 + 0x138) = 0xfffffffd;
        return -3;
      }
      *(code **)((long)pvVar1 + 0x10) = cvLsDQJac;
      pCVar3 = cv_mem;
    }
    *(CVodeMem *)((long)pvVar1 + 0x18) = pCVar3;
    if (*(long *)((long)pvVar1 + 0x58) == 0) {
      lVar4 = SUNMatClone(*(undefined8 *)((long)pvVar1 + 0x50));
      *(long *)((long)pvVar1 + 0x58) = lVar4;
      if (lVar4 == 0) {
        cvProcessError(cv_mem,-4,0x5bb,"cvLsInitialize",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                       ,"A memory request failed.");
        *(undefined4 *)((long)pvVar1 + 0x138) = 0xfffffffc;
        return -4;
      }
    }
  }
  else {
    *(void **)((long)pvVar1 + 0x130) = cv_mem->cv_user_data;
  }
  *(undefined8 *)((long)pvVar1 + 0xb8) = 0;
  *(undefined8 *)((long)pvVar1 + 0xc0) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
  *(undefined8 *)((long)pvVar1 + 0xb0) = 0;
  *(undefined8 *)((long)pvVar1 + 200) = 0;
  *(undefined8 *)((long)pvVar1 + 0x98) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  *(undefined8 *)((long)pvVar1 + 0x88) = 0;
  *(undefined8 *)((long)pvVar1 + 0x90) = 0;
  if (*(int *)((long)pvVar1 + 0xf8) == 0) {
    pCVar3 = (CVodeMem)cv_mem->cv_user_data;
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x100) = 0;
    *(code **)((long)pvVar1 + 0x108) = cvLsDQJtimes;
    pCVar3 = cv_mem;
  }
  *(CVodeMem *)((long)pvVar1 + 0x118) = pCVar3;
  if ((*(long *)((long)pvVar1 + 0x50) == 0) && (*(long *)((long)pvVar1 + 0xd8) == 0)) {
    cv_mem->cv_lsetup =
         (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0;
  }
  iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x48));
  if (iVar2 == 3) {
    cv_mem->cv_lsetup =
         (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0;
    *(undefined4 *)((long)pvVar1 + 0x30) = 0;
  }
  iVar2 = SUNLinSolInitialize(*(undefined8 *)((long)pvVar1 + 0x48));
  *(int *)((long)pvVar1 + 0x138) = iVar2;
  return iVar2;
}

Assistant:

int cvLsInitialize(CVodeMem cv_mem)
{
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (cvls_mem->A != NULL)
  {
    /* Matrix-based case */

    if (cvls_mem->user_linsys)
    {
      /* User-supplied linear system function, reset A_data (just in case) */
      cvls_mem->A_data = cv_mem->cv_user_data;
    }
    else
    {
      /* Internal linear system function, reset pointers (just in case) */
      cvls_mem->linsys = cvLsLinSys;
      cvls_mem->A_data = cv_mem;

      /* Check if an internal or user-supplied Jacobian function is used */
      if (cvls_mem->jacDQ)
      {
        /* Internal difference quotient Jacobian. Check that A is dense or band,
           otherwise return an error */
        retval = 0;
        if (cvls_mem->A->ops->getid)
        {
          if ((SUNMatGetID(cvls_mem->A) == SUNMATRIX_DENSE) ||
              (SUNMatGetID(cvls_mem->A) == SUNMATRIX_BAND))
          {
            cvls_mem->jac    = cvLsDQJac;
            cvls_mem->J_data = cv_mem;
          }
          else { retval++; }
        }
        else { retval++; }
        if (retval)
        {
          cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                         __FILE__, "No Jacobian constructor available for SUNMatrix type");
          cvls_mem->last_flag = CVLS_ILL_INPUT;
          return (CVLS_ILL_INPUT);
        }
      }
      else
      {
        /* User-supplied Jacobian, reset J_data pointer (just in case) */
        cvls_mem->J_data = cv_mem->cv_user_data;
      }

      /* Allocate internally saved Jacobian if not already done */
      if (cvls_mem->savedJ == NULL)
      {
        cvls_mem->savedJ = SUNMatClone(cvls_mem->A);
        if (cvls_mem->savedJ == NULL)
        {
          cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                         MSG_LS_MEM_FAIL);
          cvls_mem->last_flag = CVLS_MEM_FAIL;
          return (CVLS_MEM_FAIL);
        }
      }

    } /* end matrix-based case */
  }
  else
  {
    /* Matrix-free case: ensure 'jac' and `linsys` function pointers are NULL */
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;

    cvls_mem->user_linsys = SUNFALSE;
    cvls_mem->linsys      = NULL;
    cvls_mem->A_data      = NULL;
  }

  /* reset counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set Jacobian-vector product related fields, based on jtimesDQ */
  if (cvls_mem->jtimesDQ)
  {
    cvls_mem->jtsetup = NULL;
    cvls_mem->jtimes  = cvLsDQJtimes;
    cvls_mem->jt_data = cv_mem;
  }
  else { cvls_mem->jt_data = cv_mem->cv_user_data; }

  /* if A is NULL and psetup is not present, then cvLsSetup does
     not need to be called, so set the lsetup function to NULL */
  if ((cvls_mem->A == NULL) && (cvls_mem->pset == NULL))
  {
    cv_mem->cv_lsetup = NULL;
  }

  /* When using a matrix-embedded linear solver, disable lsetup call and solution scaling */
  if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    cv_mem->cv_lsetup  = NULL;
    cvls_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine, and return result */
  cvls_mem->last_flag = SUNLinSolInitialize(cvls_mem->LS);
  return (cvls_mem->last_flag);
}